

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool deqp::gls::BuiltinPrecisionTests::contains<tcu::Vector<float,2>>
               (IVal *ival,Vector<float,_2> *value)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  
  lVar8 = 0;
  bVar7 = false;
  do {
    while( true ) {
      fVar1 = value->m_data[lVar8];
      dVar9 = (double)fVar1;
      dVar4 = dVar9;
      if (NAN(fVar1)) {
        dVar4 = INFINITY;
        dVar9 = -INFINITY;
      }
      bVar2 = dVar4 < ival->m_data[lVar8].m_lo;
      bVar3 = ival->m_data[lVar8].m_hi < dVar9;
      if ((!NAN(fVar1)) || (bVar2 || bVar3)) break;
      bVar6 = ival->m_data[lVar8].m_hasNaN;
      lVar8 = 1;
      bVar2 = bVar7 || (~bVar6 & 1) != 0;
      bVar7 = true;
      if (bVar2) goto LAB_016d198a;
    }
    lVar8 = 1;
    bVar5 = !bVar7;
    bVar7 = true;
  } while (bVar5 && (!bVar2 && !bVar3));
  bVar6 = !bVar2 && !bVar3;
LAB_016d198a:
  return (bool)(bVar6 & 1);
}

Assistant:

bool contains (const typename Traits<T>::IVal& ival, const T& value)
{
	return Traits<T>::doContains(ival, value);
}